

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O0

csp_packet_t * csp_read(csp_conn_t *conn,uint32_t timeout)

{
  int iVar1;
  long in_RDI;
  csp_packet_t *packet;
  csp_conn_t *in_stack_ffffffffffffffd8;
  csp_packet_t *local_8;
  
  local_8 = (csp_packet_t *)0x0;
  if ((in_RDI == 0) || (*(int *)(in_RDI + 4) != 1)) {
    local_8 = (csp_packet_t *)0x0;
  }
  else {
    iVar1 = csp_queue_dequeue((csp_queue_handle_t)0x0,in_stack_ffffffffffffffd8,0);
    if (iVar1 == 0) {
      if (((*(byte *)(in_RDI + 9) & 2) != 0) && (*(int *)(in_RDI + 0xe8) != 0)) {
        csp_rdp_check_ack(in_stack_ffffffffffffffd8);
      }
    }
    else {
      local_8 = (csp_packet_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

csp_packet_t * csp_read(csp_conn_t * conn, uint32_t timeout) {

	csp_packet_t * packet = NULL;

	if ((conn == NULL) || (conn->state != CONN_OPEN)) {
		return NULL;
	}

#if (CSP_USE_RDP)
	// RDP: timeout can either be 0 (for no hang poll/check) or minimum the "connection timeout"
	if (timeout && (conn->idin.flags & CSP_FRDP) && (timeout < conn->rdp.conn_timeout)) {
		timeout = conn->rdp.conn_timeout;
	}
#endif

	if (csp_queue_dequeue(conn->rx_queue, &packet, timeout) != CSP_QUEUE_OK) {
		return NULL;
	}

#if (CSP_USE_RDP)
	/* Packet read could trigger ACK transmission */
	if ((conn->idin.flags & CSP_FRDP) && conn->rdp.delayed_acks) {
		csp_rdp_check_ack(conn);
	}
#endif

	return packet;
}